

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O0

int cache_put6(uint64_t a,uint64_t b,uint64_t c,uint64_t d,uint64_t e,uint64_t f,uint64_t res1,
              uint64_t res2)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  cache_entry_t pcVar5;
  ulong uVar6;
  uint64_t new_s;
  int local_60;
  int iStack_5c;
  uint64_t s;
  cache6_entry_t bucket;
  uint64_t *s_bucket;
  uint64_t hash;
  uint64_t f_local;
  uint64_t e_local;
  uint64_t d_local;
  uint64_t c_local;
  uint64_t b_local;
  uint64_t a_local;
  
  uVar4 = cache_hash6(a,b,c,d,e,f);
  puVar1 = (ulong *)(cache_status + (uVar4 & cache_mask & 0xfffffffffffffffe));
  pcVar5 = cache_table + (uVar4 & cache_mask & 0xfffffffffffffffe);
  uVar3 = *puVar1;
  if ((uVar3 & 0x8000000080000000) == 0) {
    s_bucket._4_4_ = (undefined4)(uVar4 >> 0x20);
    iStack_5c = (int)(uVar3 >> 0x20);
    local_60 = (int)uVar3;
    uVar6 = CONCAT44(s_bucket._4_4_,s_bucket._4_4_) & 0x7fff00007fff0000 | 0x400000004000000 |
            (ulong)(iStack_5c + 1U & 0xffff) << 0x20 | (ulong)(local_60 + 1U & 0xffff);
    LOCK();
    uVar2 = *puVar1;
    if (uVar3 == uVar2) {
      *puVar1 = uVar6 | 0x8000000080000000;
    }
    UNLOCK();
    if (uVar3 == uVar2) {
      pcVar5->a = a;
      pcVar5->b = b;
      pcVar5->c = c;
      pcVar5[1].a = d;
      pcVar5[1].b = e;
      pcVar5[1].c = f;
      pcVar5->res = res1;
      pcVar5[1].res = res2;
      *puVar1 = uVar6;
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int
cache_put6(uint64_t a, uint64_t b, uint64_t c, uint64_t d, uint64_t e, uint64_t f, uint64_t res1, uint64_t res2)
{
    const uint64_t hash = cache_hash6(a, b, c, d, e, f);
#if CACHE_MASK
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash & cache_mask)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash & cache_mask)/2;
#else
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash % cache_size)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash % cache_size)/2;
#endif
    // can be relaxed, we use cas afterwards to claim it
    uint64_t s = atomic_load_explicit(s_bucket, memory_order_relaxed);
    // abort if locked
    if (s & 0x8000000080000000LL) return 0;
    // create new
    uint64_t new_s = ((hash>>32) & 0x7fff0000) | 0x04000000;
    new_s |= (new_s<<32);
    new_s |= (((s>>32)+1)&0xffff)<<32;
    new_s |= (s+1)&0xffff;
    // use cas to claim bucket
    if (!atomic_compare_exchange_weak(s_bucket, &s, new_s | 0x8000000080000000LL)) return 0;
    // cas succesful: write data
    bucket->a = a;
    bucket->b = b;
    bucket->c = c;
    bucket->d = d;
    bucket->e = e;
    bucket->f = f;
    bucket->res = res1;
    bucket->res2 = res2;
    // unlock status field
    atomic_store_explicit(s_bucket, new_s, memory_order_release);
    return 1;
}